

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

int pzshape::TPZShapePrism::NConnectShapeF(int side,int order)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = 1;
  if (5 < side) {
    if (side < 0xf) {
      iVar2 = order + -1;
    }
    else {
      if ((side == 0x13) || (side == 0xf)) {
        iVar2 = (order + -1) * (order + -2);
        iVar2 = iVar2 - (iVar2 >> 0x1f);
      }
      else {
        if (side < 0x13) {
          return (order + -1) * (order + -1);
        }
        if (side != 0x14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZShapePrism::NConnectShapeF, bad parameter side ",0x32
                    );
          plVar1 = (long *)std::ostream::operator<<(&std::cerr,side);
          std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
          std::ostream::put((char)plVar1);
          std::ostream::flush();
          return 0;
        }
        iVar2 = (order + -2) * (order + -1) * (order + -1);
        iVar2 = iVar2 - (iVar2 >> 0x1f);
      }
      iVar2 = iVar2 >> 1;
    }
  }
  return iVar2;
}

Assistant:

int TPZShapePrism::NConnectShapeF(int side, int order) {
		if(side<6) return 1;//0 a 4
		if(side<15) return (order-1);//6 a 14
		if(side==15 || side==19) {
			return ((order-2)*(order-1)/2);
		}
		if(side>15 && side<19) {//16,17,18
			return ((order-1)*(order-1));
		}
		if(side==20) {
			return ((order-2)*(order-1)*(order-1)/2);
		}
		PZError << "TPZShapePrism::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}